

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::AttachmentTextureCubeMapFaceCase::test
          (AttachmentTextureCubeMapFaceCase *this)

{
  CallLogWrapper *this_00;
  GLenum textarget;
  GLuint reference;
  long lVar1;
  GLuint textureID;
  GLuint framebufferID;
  
  lVar1 = 0;
  framebufferID = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(this_00,1,&textureID);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,textureID);
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    glu::CallLogWrapper::glTexImage2D
              (this_00,*(GLenum *)((long)&DAT_00661440 + lVar1),0,0x1907,0x40,0x40,0,0x1907,0x1401,
               (void *)0x0);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    textarget = *(GLenum *)((long)&DAT_00661440 + lVar1);
    reference = textureID;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,textarget,textureID,0);
    checkColorAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8cd3,textarget,reference);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x18);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&textureID);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_CUBE_MAP, textureID);
			expectError(GL_NO_ERROR);

			const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(faces); ++ndx)
				glTexImage2D(faces[ndx], 0, GL_RGB, 64, 64, 0, GL_RGB, GL_UNSIGNED_BYTE, DE_NULL);
			expectError(GL_NO_ERROR);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(faces); ++ndx)
			{
				glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, faces[ndx], textureID, 0);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, faces[ndx]);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}